

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O0

void beltFMTStart(void *state,u32 mod,size_t count,octet *key,size_t len)

{
  size_t sVar1;
  void *in_RCX;
  ulong in_RDX;
  undefined4 in_ESI;
  void *in_RDI;
  octet *in_R8;
  belt_fmt_st *st;
  size_t in_stack_00000090;
  u32 in_stack_0000009c;
  void *in_stack_ffffffffffffffc8;
  
  beltWBLStart(in_RCX,in_R8,(size_t)in_RDI);
  *(undefined4 *)((long)in_RDI + 0x48) = in_ESI;
  *(ulong *)((long)in_RDI + 0x50) = in_RDX + 1 >> 1;
  *(ulong *)((long)in_RDI + 0x58) = in_RDX >> 1;
  sVar1 = beltFMTCalcB(in_stack_0000009c,in_stack_00000090);
  *(size_t *)((long)in_RDI + 0x60) = sVar1;
  sVar1 = beltFMTCalcB(in_stack_0000009c,in_stack_00000090);
  *(size_t *)((long)in_RDI + 0x68) = sVar1;
  *(short *)((long)in_RDI + 0x70) = (short)in_ESI;
  *(short *)((long)in_RDI + 0x72) = (short)in_RDX;
  memCopy(in_RDI,in_stack_ffffffffffffffc8,0x15a419);
  return;
}

Assistant:

void beltFMTStart(void* state, u32 mod, size_t count, const octet key[], 
	size_t len)
{
	belt_fmt_st* st = (belt_fmt_st*)state;
	ASSERT(2 <= mod && mod <= 65536);
	ASSERT(2 <= count && count <= 600);
	ASSERT(memIsValid(state, beltFMT_keep(mod, count)));
	// инициализировать состояние
	beltWBLStart(st->wbl, key, len);
	st->mod = mod;
	st->n1 = (count + 1) / 2;
	st->n2 = count / 2;
	st->b1 = beltFMTCalcB(mod, st->n1);
	st->b2 = beltFMTCalcB(mod, st->n2);
#if (OCTET_ORDER == LITTLE_ENDIAN)
	((u16*)st->iv)[0] = (u16)mod;
	((u16*)st->iv)[1] = (u16)count;
#else
	((u16*)st->iv)[0] = u16Rev((u16)mod);
	((u16*)st->iv)[1] = u16Rev((u16)count);
#endif
	memCopy(st->iv + 20, st->iv, 4);
}